

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O0

int __thiscall BamTools::FilterTool::Run(FilterTool *this,int argc,char **argv)

{
  bool bVar1;
  FilterSettings *settings;
  long in_RDI;
  int in_stack_000003c4;
  char **in_stack_000003c8;
  int in_stack_000003d4;
  FilterToolPrivate *in_stack_00000468;
  FilterToolPrivate *in_stack_ffffffffffffffd0;
  uint local_4;
  
  Options::Parse(in_stack_000003d4,in_stack_000003c8,in_stack_000003c4);
  settings = (FilterSettings *)operator_new(0x148);
  FilterToolPrivate::FilterToolPrivate(in_stack_ffffffffffffffd0,settings);
  *(FilterSettings **)(in_RDI + 0x10) = settings;
  bVar1 = FilterToolPrivate::Run(in_stack_00000468);
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

int FilterTool::Run(int argc, char* argv[])
{

    // parse command line arguments
    Options::Parse(argc, argv, 1);

    // initialize FilterTool with settings
    m_impl = new FilterToolPrivate(m_settings);

    // run FilterTool, return success/fail
    if (m_impl->Run())
        return 0;
    else
        return 1;
}